

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<4>::AddWithCarry(BigUnsigned<4> *this,int index,uint64_t value)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong in_RDX;
  int in_ESI;
  int *in_RDI;
  uint32_t low;
  uint32_t high;
  uint32_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  if ((in_RDX != 0) && (in_ESI < 4)) {
    iVar2 = (int)(in_RDX >> 0x20);
    uVar1 = (uint)in_RDX;
    in_RDI[(long)in_ESI + 1] = uVar1 + in_RDI[(long)in_ESI + 1];
    if (((uint)in_RDI[(long)in_ESI + 1] < uVar1) && (iVar2 = iVar2 + 1, iVar2 == 0)) {
      AddWithCarry((BigUnsigned<4> *)(in_RDX & 0xffffffff),in_stack_ffffffffffffffdc,
                   in_stack_ffffffffffffffd8);
    }
    else if (iVar2 == 0) {
      piVar3 = std::max<int>((int *)&stack0xffffffffffffffd8,in_RDI);
      piVar3 = std::min<int>((int *)&stack0xffffffffffffffdc,piVar3);
      *in_RDI = *piVar3;
    }
    else {
      AddWithCarry((BigUnsigned<4> *)CONCAT44(iVar2,uVar1),in_stack_ffffffffffffffdc,
                   in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void AddWithCarry(int index, uint64_t value) {
    if (value && index < max_words) {
      uint32_t high = value >> 32;
      uint32_t low = value & 0xffffffff;
      words_[index] += low;
      if (words_[index] < low) {
        ++high;
        if (high == 0) {
          // Carry from the low word caused our high word to overflow.
          // Short circuit here to do the right thing.
          AddWithCarry(index + 2, static_cast<uint32_t>(1));
          return;
        }
      }
      if (high > 0) {
        AddWithCarry(index + 1, high);
      } else {
        // Normally 32-bit AddWithCarry() sets size_, but since we don't call
        // it when `high` is 0, do it ourselves here.
        size_ = (std::min)(max_words, (std::max)(index + 1, size_));
      }
    }
  }